

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

ValidateXrHandleResult VerifyXrInstanceHandle(XrInstance *handle_to_check)

{
  ValidateXrHandleResult VVar1;
  XrInstance *handle_to_check_local;
  
  VVar1 = HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::verifyHandle
                    (&g_instance_info.
                      super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                     handle_to_check);
  return VVar1;
}

Assistant:

ValidateXrHandleResult VerifyXrInstanceHandle(const XrInstance* handle_to_check) {
    return g_instance_info.verifyHandle(handle_to_check);
}